

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O1

void __thiscall cs::statement_expression::~statement_expression(statement_expression *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  tree_type<cs::token_base_*>::destroy((this->mTree).mRoot);
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_0032c410;
  this_00 = (this->super_statement_base).context.
            super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

statement_expression() = delete;